

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O0

bool __thiscall
cmExecuteProcessCommand::InitialPass
          (cmExecuteProcessCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *this_00;
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  cmsysProcess *pcVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  uint uVar9;
  size_type sVar10;
  const_reference pvVar11;
  ulong uVar12;
  reference pvVar13;
  ostream *poVar14;
  char *pcVar15;
  undefined8 uVar16;
  reference command;
  reference pcVar17;
  char local_668 [8];
  char buf [100];
  iterator iStack_5f8;
  int v;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_5f0;
  int local_5e4;
  char *pcStack_5e0;
  int p;
  char *data;
  undefined1 local_5d0 [4];
  int length;
  vector<char,_std::allocator<char>_> tempError;
  vector<char,_std::allocator<char>_> tempOutput;
  iterator iStack_598;
  bool merge_output;
  uint local_58c;
  cmsysProcess *pcStack_588;
  uint i_2;
  cmsysProcess *cp;
  string local_578;
  double local_558;
  double timeout;
  allocator local_541;
  string local_540;
  uint local_520;
  allocator local_519;
  uint i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  undefined1 local_4d8 [8];
  string e_1;
  undefined1 local_498 [8];
  ostringstream e;
  value_type local_320;
  allocator local_311;
  string local_310;
  allocator local_2e9;
  string local_2e8;
  allocator local_2c1;
  string local_2c0;
  allocator local_299;
  string local_298;
  allocator local_271;
  string local_270;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  undefined4 local_200;
  allocator local_1f9;
  string local_1f8;
  vector<const_char_*,_std::allocator<const_char_*>_> local_1d8;
  ulong local_1b8;
  size_t i;
  string working_directory;
  string result_variable;
  string error_variable;
  string output_variable;
  string error_file;
  string output_file;
  string input_file;
  string timeout_string;
  bool error_strip_trailing_whitespace;
  bool output_strip_trailing_whitespace;
  bool error_quiet;
  size_type sStack_a8;
  bool output_quiet;
  size_t command_index;
  string local_98 [7];
  bool doing_command;
  string arguments;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  cmds;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmExecuteProcessCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar10 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::size(args);
  if (sVar10 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"called with incorrect number of arguments",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_004e11a7;
  }
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            *)((long)&arguments.field_2 + 8));
  std::__cxx11::string::string(local_98);
  bVar6 = false;
  sStack_a8 = 0;
  bVar2 = false;
  bVar3 = false;
  timeout_string.field_2._M_local_buf[0xd] = '\0';
  timeout_string.field_2._M_local_buf[0xc] = '\0';
  std::__cxx11::string::string((string *)(input_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(output_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(error_file.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(output_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(error_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(result_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(working_directory.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&i);
  for (local_1b8 = 0; uVar12 = local_1b8,
      sVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_2_local), uVar12 < sVar10; local_1b8 = local_1b8 + 1) {
    pvVar11 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)param_2_local,local_1b8);
    bVar5 = std::operator==(pvVar11,"COMMAND");
    if (bVar5) {
      bVar6 = true;
      this_00 = (vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                 *)((long)&arguments.field_2 + 8);
      sStack_a8 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ::size(this_00);
      local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1d8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_1d8);
      std::
      vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
      ::push_back(this_00,&local_1d8);
      std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(&local_1d8);
    }
    else {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)param_2_local,local_1b8);
      bVar5 = std::operator==(pvVar11,"OUTPUT_VARIABLE");
      if (bVar5) {
        bVar6 = false;
        uVar12 = local_1b8 + 1;
        local_1b8 = uVar12;
        sVar10 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local);
        if (sVar10 <= uVar12) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1f8," called with no value for OUTPUT_VARIABLE.",&local_1f9);
          cmCommand::SetError(&this->super_cmCommand,&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          this_local._7_1_ = 0;
          local_200 = 1;
          goto LAB_004e10b9;
        }
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local,local_1b8);
        std::__cxx11::string::operator=
                  ((string *)(error_variable.field_2._M_local_buf + 8),(string *)pvVar11);
      }
      else {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)param_2_local,local_1b8);
        bVar5 = std::operator==(pvVar11,"ERROR_VARIABLE");
        if (bVar5) {
          bVar6 = false;
          uVar12 = local_1b8 + 1;
          local_1b8 = uVar12;
          sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local);
          if (sVar10 <= uVar12) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_220," called with no value for ERROR_VARIABLE.",&local_221);
            cmCommand::SetError(&this->super_cmCommand,&local_220);
            std::__cxx11::string::~string((string *)&local_220);
            std::allocator<char>::~allocator((allocator<char> *)&local_221);
            this_local._7_1_ = 0;
            local_200 = 1;
            goto LAB_004e10b9;
          }
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)param_2_local,local_1b8);
          std::__cxx11::string::operator=
                    ((string *)(result_variable.field_2._M_local_buf + 8),(string *)pvVar11);
        }
        else {
          pvVar11 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)param_2_local,local_1b8);
          bVar5 = std::operator==(pvVar11,"RESULT_VARIABLE");
          if (bVar5) {
            bVar6 = false;
            uVar12 = local_1b8 + 1;
            local_1b8 = uVar12;
            sVar10 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local);
            if (sVar10 <= uVar12) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_248," called with no value for RESULT_VARIABLE.",
                         &local_249);
              cmCommand::SetError(&this->super_cmCommand,&local_248);
              std::__cxx11::string::~string((string *)&local_248);
              std::allocator<char>::~allocator((allocator<char> *)&local_249);
              this_local._7_1_ = 0;
              local_200 = 1;
              goto LAB_004e10b9;
            }
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)param_2_local,local_1b8);
            std::__cxx11::string::operator=
                      ((string *)(working_directory.field_2._M_local_buf + 8),(string *)pvVar11);
          }
          else {
            pvVar11 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)param_2_local,local_1b8);
            bVar5 = std::operator==(pvVar11,"WORKING_DIRECTORY");
            if (bVar5) {
              bVar6 = false;
              uVar12 = local_1b8 + 1;
              local_1b8 = uVar12;
              sVar10 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local);
              if (sVar10 <= uVar12) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_270," called with no value for WORKING_DIRECTORY.",
                           &local_271);
                cmCommand::SetError(&this->super_cmCommand,&local_270);
                std::__cxx11::string::~string((string *)&local_270);
                std::allocator<char>::~allocator((allocator<char> *)&local_271);
                this_local._7_1_ = 0;
                local_200 = 1;
                goto LAB_004e10b9;
              }
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)param_2_local,local_1b8);
              std::__cxx11::string::operator=((string *)&i,(string *)pvVar11);
            }
            else {
              pvVar11 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)param_2_local,local_1b8);
              bVar5 = std::operator==(pvVar11,"INPUT_FILE");
              if (bVar5) {
                bVar6 = false;
                uVar12 = local_1b8 + 1;
                local_1b8 = uVar12;
                sVar10 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local);
                if (sVar10 <= uVar12) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_298," called with no value for INPUT_FILE.",&local_299
                            );
                  cmCommand::SetError(&this->super_cmCommand,&local_298);
                  std::__cxx11::string::~string((string *)&local_298);
                  std::allocator<char>::~allocator((allocator<char> *)&local_299);
                  this_local._7_1_ = 0;
                  local_200 = 1;
                  goto LAB_004e10b9;
                }
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)param_2_local,local_1b8);
                std::__cxx11::string::operator=
                          ((string *)(output_file.field_2._M_local_buf + 8),(string *)pvVar11);
              }
              else {
                pvVar11 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)param_2_local,local_1b8);
                bVar5 = std::operator==(pvVar11,"OUTPUT_FILE");
                if (bVar5) {
                  bVar6 = false;
                  uVar12 = local_1b8 + 1;
                  local_1b8 = uVar12;
                  sVar10 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)param_2_local);
                  if (sVar10 <= uVar12) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_2c0," called with no value for OUTPUT_FILE.",
                               &local_2c1);
                    cmCommand::SetError(&this->super_cmCommand,&local_2c0);
                    std::__cxx11::string::~string((string *)&local_2c0);
                    std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
                    this_local._7_1_ = 0;
                    local_200 = 1;
                    goto LAB_004e10b9;
                  }
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)param_2_local,local_1b8);
                  std::__cxx11::string::operator=
                            ((string *)(error_file.field_2._M_local_buf + 8),(string *)pvVar11);
                }
                else {
                  pvVar11 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)param_2_local,local_1b8);
                  bVar5 = std::operator==(pvVar11,"ERROR_FILE");
                  if (bVar5) {
                    bVar6 = false;
                    uVar12 = local_1b8 + 1;
                    local_1b8 = uVar12;
                    sVar10 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)param_2_local);
                    if (sVar10 <= uVar12) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_2e8," called with no value for ERROR_FILE.",
                                 &local_2e9);
                      cmCommand::SetError(&this->super_cmCommand,&local_2e8);
                      std::__cxx11::string::~string((string *)&local_2e8);
                      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
                      this_local._7_1_ = 0;
                      local_200 = 1;
                      goto LAB_004e10b9;
                    }
                    pvVar11 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)param_2_local,local_1b8);
                    std::__cxx11::string::operator=
                              ((string *)(output_variable.field_2._M_local_buf + 8),
                               (string *)pvVar11);
                  }
                  else {
                    pvVar11 = std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)param_2_local,local_1b8);
                    bVar5 = std::operator==(pvVar11,"TIMEOUT");
                    if (bVar5) {
                      bVar6 = false;
                      uVar12 = local_1b8 + 1;
                      local_1b8 = uVar12;
                      sVar10 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)param_2_local);
                      if (sVar10 <= uVar12) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_310," called with no value for TIMEOUT.",
                                   &local_311);
                        cmCommand::SetError(&this->super_cmCommand,&local_310);
                        std::__cxx11::string::~string((string *)&local_310);
                        std::allocator<char>::~allocator((allocator<char> *)&local_311);
                        this_local._7_1_ = 0;
                        local_200 = 1;
                        goto LAB_004e10b9;
                      }
                      pvVar11 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)param_2_local,local_1b8);
                      std::__cxx11::string::operator=
                                ((string *)(input_file.field_2._M_local_buf + 8),(string *)pvVar11);
                    }
                    else {
                      pvVar11 = std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              *)param_2_local,local_1b8);
                      bVar5 = std::operator==(pvVar11,"OUTPUT_QUIET");
                      if (bVar5) {
                        bVar6 = false;
                        bVar2 = true;
                      }
                      else {
                        pvVar11 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                *)param_2_local,local_1b8);
                        bVar5 = std::operator==(pvVar11,"ERROR_QUIET");
                        if (bVar5) {
                          bVar6 = false;
                          bVar3 = true;
                        }
                        else {
                          pvVar11 = std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1b8);
                          bVar5 = std::operator==(pvVar11,"OUTPUT_STRIP_TRAILING_WHITESPACE");
                          if (bVar5) {
                            bVar6 = false;
                            timeout_string.field_2._M_local_buf[0xd] = '\x01';
                          }
                          else {
                            pvVar11 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1b8);
                            bVar5 = std::operator==(pvVar11,"ERROR_STRIP_TRAILING_WHITESPACE");
                            if (bVar5) {
                              bVar6 = false;
                              timeout_string.field_2._M_local_buf[0xc] = '\x01';
                            }
                            else {
                              if (!bVar6) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_498);
                                poVar14 = std::operator<<((ostream *)local_498,
                                                          " given unknown argument \"");
                                pvVar11 = std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[]((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)param_2_local,local_1b8);
                                poVar14 = std::operator<<(poVar14,(string *)pvVar11);
                                std::operator<<(poVar14,"\".");
                                std::__cxx11::ostringstream::str();
                                cmCommand::SetError(&this->super_cmCommand,
                                                    (string *)((long)&e_1.field_2 + 8));
                                std::__cxx11::string::~string
                                          ((string *)(e_1.field_2._M_local_buf + 8));
                                this_local._7_1_ = 0;
                                local_200 = 1;
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_498);
                                goto LAB_004e10b9;
                              }
                              pvVar13 = std::
                                        vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                        ::operator[]((
                                                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                                  *)((long)&arguments.field_2 + 8),sStack_a8);
                              std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)param_2_local,local_1b8);
                              local_320 = (value_type)std::__cxx11::string::c_str();
                              std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                                        (pvVar13,&local_320);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  pcVar15 = (char *)std::__cxx11::string::c_str();
  bVar6 = cmMakefile::CanIWriteThisFile(pcVar1,pcVar15);
  if (bVar6) {
    bVar6 = std::
            vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
            ::empty((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                     *)((long)&arguments.field_2 + 8));
    if (bVar6) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&i_1," called with no COMMAND argument.",&local_519);
      cmCommand::SetError(&this->super_cmCommand,(string *)&i_1);
      std::__cxx11::string::~string((string *)&i_1);
      std::allocator<char>::~allocator((allocator<char> *)&local_519);
      this_local._7_1_ = 0;
      local_200 = 1;
    }
    else {
      for (local_520 = 0; uVar12 = (ulong)local_520,
          sVar10 = std::
                   vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                           *)((long)&arguments.field_2 + 8)), uVar12 < sVar10;
          local_520 = local_520 + 1) {
        pvVar13 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ::operator[]((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                *)((long)&arguments.field_2 + 8),(ulong)local_520);
        bVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::empty(pvVar13);
        if (bVar6) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_540," given COMMAND argument with no value.",&local_541);
          cmCommand::SetError(&this->super_cmCommand,&local_540);
          std::__cxx11::string::~string((string *)&local_540);
          std::allocator<char>::~allocator((allocator<char> *)&local_541);
          this_local._7_1_ = 0;
          local_200 = 1;
          goto LAB_004e10b9;
        }
        pvVar13 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ::operator[]((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                *)((long)&arguments.field_2 + 8),(ulong)local_520);
        timeout = 0.0;
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  (pvVar13,(value_type *)&timeout);
      }
      local_558 = -1.0;
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        uVar16 = std::__cxx11::string::c_str();
        iVar8 = __isoc99_sscanf(uVar16,"%lg",&local_558);
        if (iVar8 != 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_578," called with TIMEOUT value that could not be parsed.",
                     (allocator *)((long)&cp + 7));
          cmCommand::SetError(&this->super_cmCommand,&local_578);
          std::__cxx11::string::~string((string *)&local_578);
          std::allocator<char>::~allocator((allocator<char> *)((long)&cp + 7));
          this_local._7_1_ = 0;
          local_200 = 1;
          goto LAB_004e10b9;
        }
      }
      pcStack_588 = cmsysProcess_New();
      for (local_58c = 0; uVar12 = (ulong)local_58c,
          sVar10 = std::
                   vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                   ::size((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                           *)((long)&arguments.field_2 + 8)), pcVar4 = pcStack_588, uVar12 < sVar10;
          local_58c = local_58c + 1) {
        pvVar13 = std::
                  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                  ::operator[]((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
                                *)((long)&arguments.field_2 + 8),(ulong)local_58c);
        iStack_598 = std::vector<const_char_*,_std::allocator<const_char_*>_>::begin(pvVar13);
        command = __gnu_cxx::
                  __normal_iterator<const_char_**,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                  ::operator*(&stack0xfffffffffffffa68);
        cmsysProcess_AddCommand(pcVar4,command);
      }
      uVar12 = std::__cxx11::string::empty();
      pcVar4 = pcStack_588;
      if ((uVar12 & 1) == 0) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetWorkingDirectory(pcVar4,pcVar15);
      }
      cmsysProcess_SetOption(pcStack_588,0,1);
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
      uVar12 = std::__cxx11::string::empty();
      pcVar4 = pcStack_588;
      if ((uVar12 & 1) == 0) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetPipeFile(pcVar4,1,pcVar15);
      }
      uVar12 = std::__cxx11::string::empty();
      pcVar4 = pcStack_588;
      if ((uVar12 & 1) == 0) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetPipeFile(pcVar4,2,pcVar15);
      }
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) == 0) &&
         (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&output_variable.field_2 + 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&error_file.field_2 + 8)), pcVar4 = pcStack_588,
         !(bool)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_)) {
        pcVar15 = (char *)std::__cxx11::string::c_str();
        cmsysProcess_SetPipeFile(pcVar4,3,pcVar15);
      }
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) == 0) &&
         (_Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&error_variable.field_2 + 8),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&result_variable.field_2 + 8)), _Var7)) {
        tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
      }
      if (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ != '\0') {
        cmsysProcess_SetOption(pcStack_588,2,1);
      }
      if (0.0 <= local_558) {
        cmsysProcess_SetTimeout(pcStack_588,local_558);
      }
      cmsysProcess_Execute(pcStack_588);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_5d0);
      while (local_5e4 = cmsysProcess_WaitForData
                                   (pcStack_588,&stack0xfffffffffffffa20,(int *)((long)&data + 4),
                                    (double *)0x0), local_5e4 != 0) {
        if ((local_5e4 != 2) || (bVar2)) {
          if ((local_5e4 == 3) && (!bVar3)) {
            uVar12 = std::__cxx11::string::empty();
            if ((uVar12 & 1) == 0) {
              cmExecuteProcessCommandAppend
                        ((vector<char,_std::allocator<char>_> *)local_5d0,pcStack_5e0,data._4_4_);
            }
            else {
              cmSystemTools::Stderr(pcStack_5e0,(long)data._4_4_);
            }
          }
        }
        else {
          uVar12 = std::__cxx11::string::empty();
          if ((uVar12 & 1) == 0) {
            cmExecuteProcessCommandAppend
                      ((vector<char,_std::allocator<char>_> *)
                       &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10
                       ,pcStack_5e0,data._4_4_);
          }
          else {
            cmSystemTools::Stdout(pcStack_5e0,(long)data._4_4_);
          }
        }
      }
      cmsysProcess_WaitForExit(pcStack_588,(double *)0x0);
      cmExecuteProcessCommandFixText
                ((vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                 (bool)timeout_string.field_2._M_local_buf[0xd]);
      cmExecuteProcessCommandFixText
                ((vector<char,_std::allocator<char>_> *)local_5d0,
                 (bool)timeout_string.field_2._M_local_buf[0xc]);
      uVar12 = std::__cxx11::string::empty();
      if (((uVar12 & 1) == 0) &&
         (bVar6 = std::vector<char,_std::allocator<char>_>::empty
                            ((vector<char,_std::allocator<char>_> *)
                             &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10), !bVar6)) {
        pcVar1 = (this->super_cmCommand).Makefile;
        local_5f0._M_current =
             (char *)std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)
                                &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 field_0x10);
        pcVar17 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                  operator*(&local_5f0);
        cmMakefile::AddDefinition(pcVar1,(string *)((long)&error_variable.field_2 + 8),pcVar17);
      }
      if (((tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ == '\0') &&
          (uVar12 = std::__cxx11::string::empty(), (uVar12 & 1) == 0)) &&
         (bVar6 = std::vector<char,_std::allocator<char>_>::empty
                            ((vector<char,_std::allocator<char>_> *)local_5d0), !bVar6)) {
        pcVar1 = (this->super_cmCommand).Makefile;
        iStack_5f8 = std::vector<char,_std::allocator<char>_>::begin
                               ((vector<char,_std::allocator<char>_> *)local_5d0);
        pcVar17 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
                  operator*(&stack0xfffffffffffffa08);
        cmMakefile::AddDefinition(pcVar1,(string *)((long)&result_variable.field_2 + 8),pcVar17);
      }
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        iVar8 = cmsysProcess_GetState(pcStack_588);
        switch(iVar8) {
        case 1:
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar15 = cmsysProcess_GetErrorString(pcStack_588);
          cmMakefile::AddDefinition(pcVar1,(string *)((long)&working_directory.field_2 + 8),pcVar15)
          ;
          break;
        case 2:
          pcVar1 = (this->super_cmCommand).Makefile;
          pcVar15 = cmsysProcess_GetExceptionString(pcStack_588);
          cmMakefile::AddDefinition(pcVar1,(string *)((long)&working_directory.field_2 + 8),pcVar15)
          ;
          break;
        case 4:
          uVar9 = cmsysProcess_GetExitValue(pcStack_588);
          sprintf(local_668,"%d",(ulong)uVar9);
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,
                     (string *)((long)&working_directory.field_2 + 8),local_668);
          break;
        case 5:
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,
                     (string *)((long)&working_directory.field_2 + 8),
                     "Process terminated due to timeout");
        }
      }
      cmsysProcess_Delete(pcStack_588);
      this_local._7_1_ = 1;
      local_200 = 1;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_5d0);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)
                 &tempError.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    }
  }
  else {
    std::operator+(&local_4f8,"attempted to output into a file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&error_file.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d8,
                   &local_4f8," into a source directory.");
    std::__cxx11::string::~string((string *)&local_4f8);
    cmCommand::SetError(&this->super_cmCommand,(string *)local_4d8);
    cmSystemTools::SetFatalErrorOccured();
    this_local._7_1_ = 0;
    local_200 = 1;
    std::__cxx11::string::~string((string *)local_4d8);
  }
LAB_004e10b9:
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string((string *)(working_directory.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(result_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(error_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output_variable.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(error_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(output_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(input_file.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_98);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::~vector((vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
             *)((long)&arguments.field_2 + 8));
LAB_004e11a7:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExecuteProcessCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  std::vector< std::vector<const char*> > cmds;
  std::string arguments;
  bool doing_command = false;
  size_t command_index = 0;
  bool output_quiet = false;
  bool error_quiet = false;
  bool output_strip_trailing_whitespace = false;
  bool error_strip_trailing_whitespace = false;
  std::string timeout_string;
  std::string input_file;
  std::string output_file;
  std::string error_file;
  std::string output_variable;
  std::string error_variable;
  std::string result_variable;
  std::string working_directory;
  for(size_t i=0; i < args.size(); ++i)
    {
    if(args[i] == "COMMAND")
      {
      doing_command = true;
      command_index = cmds.size();
      cmds.push_back(std::vector<const char*>());
      }
    else if(args[i] == "OUTPUT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "RESULT_VARIABLE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        result_variable = args[i];
        }
      else
        {
        this->SetError(" called with no value for RESULT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "WORKING_DIRECTORY")
      {
      doing_command = false;
      if(++i < args.size())
        {
        working_directory = args[i];
        }
      else
        {
        this->SetError(" called with no value for WORKING_DIRECTORY.");
        return false;
        }
      }
    else if(args[i] == "INPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        input_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for INPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        output_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for OUTPUT_FILE.");
        return false;
        }
      }
    else if(args[i] == "ERROR_FILE")
      {
      doing_command = false;
      if(++i < args.size())
        {
        error_file = args[i];
        }
      else
        {
        this->SetError(" called with no value for ERROR_FILE.");
        return false;
        }
      }
    else if(args[i] == "TIMEOUT")
      {
      doing_command = false;
      if(++i < args.size())
        {
        timeout_string = args[i];
        }
      else
        {
        this->SetError(" called with no value for TIMEOUT.");
        return false;
        }
      }
    else if(args[i] == "OUTPUT_QUIET")
      {
      doing_command = false;
      output_quiet = true;
      }
    else if(args[i] == "ERROR_QUIET")
      {
      doing_command = false;
      error_quiet = true;
      }
    else if(args[i] == "OUTPUT_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      output_strip_trailing_whitespace = true;
      }
    else if(args[i] == "ERROR_STRIP_TRAILING_WHITESPACE")
      {
      doing_command = false;
      error_strip_trailing_whitespace = true;
      }
    else if(doing_command)
      {
      cmds[command_index].push_back(args[i].c_str());
      }
    else
      {
      std::ostringstream e;
      e << " given unknown argument \"" << args[i] << "\".";
      this->SetError(e.str());
      return false;
      }
    }

  if ( !this->Makefile->CanIWriteThisFile(output_file.c_str()) )
    {
    std::string e = "attempted to output into a file: " + output_file
      + " into a source directory.";
    this->SetError(e);
    cmSystemTools::SetFatalErrorOccured();
    return false;
    }

  // Check for commands given.
  if(cmds.empty())
    {
    this->SetError(" called with no COMMAND argument.");
    return false;
    }
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    if(cmds[i].empty())
      {
      this->SetError(" given COMMAND argument with no value.");
      return false;
      }
    else
      {
      // Add the null terminating pointer to the command argument list.
      cmds[i].push_back(0);
      }
    }

  // Parse the timeout string.
  double timeout = -1;
  if(!timeout_string.empty())
    {
    if(sscanf(timeout_string.c_str(), "%lg", &timeout) != 1)
      {
      this->SetError(" called with TIMEOUT value that could not be parsed.");
      return false;
      }
    }

  // Create a process instance.
  cmsysProcess* cp = cmsysProcess_New();

  // Set the command sequence.
  for(unsigned int i=0; i < cmds.size(); ++i)
    {
    cmsysProcess_AddCommand(cp, &*cmds[i].begin());
    }

  // Set the process working directory.
  if(!working_directory.empty())
    {
    cmsysProcess_SetWorkingDirectory(cp, working_directory.c_str());
    }

  // Always hide the process window.
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);

  // Check the output variables.
  bool merge_output = false;
  if(!input_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDIN, input_file.c_str());
    }
  if(!output_file.empty())
    {
    cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDOUT,
                             output_file.c_str());
    }
  if(!error_file.empty())
    {
    if (error_file == output_file)
      {
      merge_output = true;
      }
    else
      {
      cmsysProcess_SetPipeFile(cp, cmsysProcess_Pipe_STDERR,
                               error_file.c_str());
      }
    }
  if (!output_variable.empty() && output_variable == error_variable)
    {
    merge_output = true;
    }
  if (merge_output)
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_MergeOutput, 1);
    }

  // Set the timeout if any.
  if(timeout >= 0)
    {
    cmsysProcess_SetTimeout(cp, timeout);
    }

  // Start the process.
  cmsysProcess_Execute(cp);

  // Read the process output.
  std::vector<char> tempOutput;
  std::vector<char> tempError;
  int length;
  char* data;
  int p;
  while((p = cmsysProcess_WaitForData(cp, &data, &length, 0), p))
    {
    // Put the output in the right place.
    if (p == cmsysProcess_Pipe_STDOUT && !output_quiet)
      {
      if(output_variable.empty())
        {
        cmSystemTools::Stdout(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempOutput, data, length);
        }
      }
    else if(p == cmsysProcess_Pipe_STDERR && !error_quiet)
      {
      if(error_variable.empty())
        {
        cmSystemTools::Stderr(data, length);
        }
      else
        {
        cmExecuteProcessCommandAppend(tempError, data, length);
        }
      }
    }

  // All output has been read.  Wait for the process to exit.
  cmsysProcess_WaitForExit(cp, 0);

  // Fix the text in the output strings.
  cmExecuteProcessCommandFixText(tempOutput,
                                 output_strip_trailing_whitespace);
  cmExecuteProcessCommandFixText(tempError,
                                 error_strip_trailing_whitespace);

  // Store the output obtained.
  if(!output_variable.empty() && !tempOutput.empty())
    {
    this->Makefile->AddDefinition(output_variable,
                                  &*tempOutput.begin());
    }
  if(!merge_output && !error_variable.empty() && !tempError.empty())
    {
    this->Makefile->AddDefinition(error_variable,
                                  &*tempError.begin());
    }

  // Store the result of running the process.
  if(!result_variable.empty())
    {
    switch(cmsysProcess_GetState(cp))
      {
      case cmsysProcess_State_Exited:
        {
        int v = cmsysProcess_GetExitValue(cp);
        char buf[100];
        sprintf(buf, "%d", v);
        this->Makefile->AddDefinition(result_variable, buf);
        }
        break;
      case cmsysProcess_State_Exception:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetExceptionString(cp));
        break;
      case cmsysProcess_State_Error:
        this->Makefile->AddDefinition(result_variable,
                                  cmsysProcess_GetErrorString(cp));
        break;
      case cmsysProcess_State_Expired:
        this->Makefile->AddDefinition(result_variable,
                                  "Process terminated due to timeout");
        break;
      }
    }

  // Delete the process instance.
  cmsysProcess_Delete(cp);

  return true;
}